

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

http_string_t get_request_header(http_context_t *ctx,char *key)

{
  uint uVar1;
  nh_kv_anchor_t *pnVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  http_string_t hVar8;
  
  sVar4 = strlen(key);
  uVar1 = (ctx->header).length;
  lVar7 = 0;
  do {
    if ((ulong)uVar1 << 4 == lVar7) {
      pcVar6 = (char *)0x0;
      uVar5 = 0;
LAB_00105992:
      hVar8.len = uVar5;
      hVar8.value = pcVar6;
      return hVar8;
    }
    pnVar2 = (ctx->header).items;
    if (sVar4 == *(uint *)((long)&(pnVar2->key).len + lVar7)) {
      pcVar6 = (ctx->raw).buf;
      iVar3 = nh_string_cmp_case_insensitive
                        (key,pcVar6 + *(uint *)((long)&(pnVar2->key).index + lVar7),(int)sVar4);
      if (iVar3 != 0) {
        uVar5 = (ulong)*(uint *)((long)&(pnVar2->value).len + lVar7);
        pcVar6 = pcVar6 + *(uint *)((long)&(pnVar2->value).index + lVar7);
        goto LAB_00105992;
      }
    }
    lVar7 = lVar7 + 0x10;
  } while( true );
}

Assistant:

http_string_t get_request_header(http_context_t *ctx, char const key[static 1]) {
    size_t len = strlen(key);
    nh_kv_anchor_t cur;
    for (uint32_t i = 0; i < ctx->header.length; ++i) {
        cur = ctx->header.items[i];
        if (cur.key.len == len && nh_string_cmp_case_insensitive(key, &ctx->raw.buf[cur.key.index], len)) {
            return (http_string_t) {
                .value = &ctx->raw.buf[cur.value.index],
                .len = cur.value.len,
            };
        }
    }
    return (http_string_t) {};
}